

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O0

void __thiscall OpenMD::CubicSpline::CubicSpline(CubicSpline *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__CubicSpline_004ea938;
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x3c1032);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x3c1040);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x3c104e);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x3c105c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x3c106d);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x3c107b);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x3c1089);
  return;
}

Assistant:

CubicSpline::CubicSpline() : isUniform(true), generated(false) {
    x_.clear();
    y_.clear();
  }